

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall spectest::JSONParser::ParseUint32(JSONParser *this,uint32_t *out_int)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  char cVar4;
  
  SkipWhitespace(this);
  uVar3 = 0;
  do {
    iVar1 = ReadChar(this);
    if (iVar1 - 0x30U < 10) {
      uVar2 = (iVar1 - 0x30U) + uVar3 * 10;
      cVar4 = uVar2 < uVar3;
      uVar3 = uVar2;
      if ((bool)cVar4) {
        PrintError(this,"uint32 overflow");
      }
    }
    else {
      PutbackChar(this);
      cVar4 = '\x03';
    }
  } while (cVar4 == '\0');
  if (cVar4 == '\x03') {
    *out_int = uVar3;
  }
  return (Result)(uint)(cVar4 != '\x03');
}

Assistant:

wabt::Result JSONParser::ParseUint32(uint32_t* out_int) {
  uint32_t result = 0;
  SkipWhitespace();
  while (1) {
    int c = ReadChar();
    if (c >= '0' && c <= '9') {
      uint32_t last_result = result;
      result = result * 10 + static_cast<uint32_t>(c - '0');
      if (result < last_result) {
        PrintError("uint32 overflow");
        return wabt::Result::Error;
      }
    } else {
      PutbackChar();
      break;
    }
  }
  *out_int = result;
  return wabt::Result::Ok;
}